

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.hpp
# Opt level: O0

void __thiscall
cs::compiler_type::build_expr
          (compiler_type *this,deque<char,_std::allocator<char>_> *buff,
          tree_type<cs::token_base_*> *tree,charset encoding)

{
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> tokens;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *in_stack_00000170;
  tree_type<cs::token_base_*> *in_stack_00000178;
  compiler_type *in_stack_00000180;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *in_stack_00000438;
  compiler_type *in_stack_00000440;
  size_t in_stack_000005c0;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *in_stack_000005c8;
  compiler_type *in_stack_000005d0;
  charset in_stack_000007bc;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *in_stack_000007c0;
  deque<char,_std::allocator<char>_> *in_stack_000007c8;
  compiler_type *in_stack_000007d0;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *in_stack_ffffffffffffffc0;
  
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)0x14466f);
  process_char_buff(in_stack_000007d0,in_stack_000007c8,in_stack_000007c0,in_stack_000007bc);
  process_brackets(in_stack_00000440,in_stack_00000438);
  kill_brackets(in_stack_000005d0,in_stack_000005c8,in_stack_000005c0);
  gen_tree(in_stack_00000180,in_stack_00000178,in_stack_00000170);
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~deque(in_stack_ffffffffffffffc0)
  ;
  return;
}

Assistant:

void build_expr(const std::deque<char> &buff, tree_type<token_base *> &tree, charset encoding = charset::utf8)
		{
			std::deque<token_base *> tokens;
			process_char_buff(buff, tokens, encoding);
			process_brackets(tokens);
			kill_brackets(tokens);
			gen_tree(tree, tokens);
		}